

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_rando_world_edits.hpp
# Opt level: O0

void PatchRandoWorldEdits::put_back_giants_in_verla_mines_keydoor_map(World *world)

{
  Map *this;
  vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_> *pvVar1;
  Map *map;
  World *world_local;
  
  this = World::map(world,0xe4);
  pvVar1 = Map::global_entity_mask_flags(this);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear(pvVar1);
  pvVar1 = Map::key_door_mask_flags(this);
  std::vector<GlobalEntityMaskFlag,_std::allocator<GlobalEntityMaskFlag>_>::clear(pvVar1);
  Map::remove_entity(this,'\x01',true);
  Map::remove_entity(this,'\0',true);
  return;
}

Assistant:

static void put_back_giants_in_verla_mines_keydoor_map(World& world)
    {
        Map* map = world.map(MAP_VERLA_MINES_KEYDOOR_NEAR_ENTRANCE);
        map->global_entity_mask_flags().clear();
        map->key_door_mask_flags().clear();
        // Remove the keydoor and an invisible cube
        map->remove_entity(1);
        map->remove_entity(0);
    }